

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch.cc
# Opt level: O2

void __thiscall leveldb::WriteBatch::WriteBatch(WriteBatch *this)

{
  (this->rep_)._M_dataplus._M_p = (pointer)&(this->rep_).field_2;
  (this->rep_)._M_string_length = 0;
  (this->rep_).field_2._M_local_buf[0] = '\0';
  Clear(this);
  return;
}

Assistant:

WriteBatch::WriteBatch() { Clear(); }